

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

int omp_target_associate_ptr
              (void *host_ptr,void *device_ptr,size_t size,size_t device_offset,int device_num)

{
  bool bVar1;
  int iVar2;
  
  if ((device_num != -10 && size != 0) && (device_ptr != (void *)0x0 && host_ptr != (void *)0x0)) {
    bVar1 = device_is_ready(device_num);
    if (bVar1) {
      iVar2 = DeviceTy::associatePtr
                        (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                         super__Vector_impl_data._M_start + device_num,host_ptr,
                         (void *)((long)device_ptr + device_offset),size);
      return iVar2;
    }
  }
  return -1;
}

Assistant:

EXTERN int omp_target_associate_ptr(void *host_ptr, void *device_ptr,
    size_t size, size_t device_offset, int device_num) {
  DP("Call to omp_target_associate_ptr with host_ptr " DPxMOD ", "
      "device_ptr " DPxMOD ", size %zu, device_offset %zu, device_num %d\n",
      DPxPTR(host_ptr), DPxPTR(device_ptr), size, device_offset, device_num);

  if (!host_ptr || !device_ptr || size <= 0) {
    DP("Call to omp_target_associate_ptr with invalid arguments\n");
    return OFFLOAD_FAIL;
  }

  if (device_num == omp_get_initial_device()) {
    DP("omp_target_associate_ptr: no association possible on the host\n");
    return OFFLOAD_FAIL;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_associate_ptr returns OFFLOAD_FAIL\n");
    return OFFLOAD_FAIL;
  }

  DeviceTy& Device = Devices[device_num];
  void *device_addr = (void *)((uint64_t)device_ptr + (uint64_t)device_offset);
  int rc = Device.associatePtr(host_ptr, device_addr, size);
  DP("omp_target_associate_ptr returns %d\n", rc);
  return rc;
}